

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O3

int __thiscall ot::commissioner::MockSocket::Connect(MockSocket *this,MockSocketPtr *aPeerSocket)

{
  event *ev;
  int iVar1;
  
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (aPeerSocket->
           super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mPeerSocket).
              super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(aPeerSocket->
              super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (this->super_Socket).mIsConnected = true;
  ev = &(this->super_Socket).mEvent;
  iVar1 = event_assign(ev,(this->super_Socket).mEventBase,-1,0x10,Socket::HandleEvent,this);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = event_add(ev,(timeval *)0x0);
  return iVar1;
}

Assistant:

int MockSocket::Connect(MockSocketPtr aPeerSocket)
{
    mPeerSocket  = aPeerSocket;
    mIsConnected = true;

    // Setup Event
    int rval = event_assign(&mEvent, mEventBase, -1, EV_PERSIST, HandleEvent, this);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = event_add(&mEvent, nullptr)) == 0);

exit:
    return rval;
}